

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O3

string * __thiscall
(anonymous_namespace)::get_timeseries_config_string_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Options *opts)

{
  bool bVar1;
  string *psVar2;
  string *extraout_RAX;
  string tsopts;
  string local_60;
  string local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"spot.timeseries(","");
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  bVar1 = cali::ConfigManager::Options::is_set((Options *)this,"timeseries.metrics");
  if (bVar1) {
    cali::ConfigManager::Options::get_abi_cxx11_(&local_40,(Options *)this,"timeseries.metrics","");
    std::__cxx11::string::_M_append((char *)&local_60,(ulong)local_40._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  anon_unknown.dwarf_5e224c::convert_timeseries_option
            ((Options *)this,"iteration_interval",&local_60);
  anon_unknown.dwarf_5e224c::convert_timeseries_option((Options *)this,"time_interval",&local_60);
  anon_unknown.dwarf_5e224c::convert_timeseries_option((Options *)this,"target_loops",&local_60);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_60._M_dataplus._M_p);
  psVar2 = (string *)std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,
                    CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                             local_60.field_2._M_local_buf[0]) + 1);
    psVar2 = extraout_RAX;
  }
  return psVar2;
}

Assistant:

std::string get_timeseries_config_string(const ConfigManager::Options& opts)
{
    std::string ret = "spot.timeseries(";
    std::string tsopts;

    if (opts.is_set("timeseries.metrics"))
        tsopts.append(opts.get("timeseries.metrics"));

    convert_timeseries_option(opts, "iteration_interval", tsopts);
    convert_timeseries_option(opts, "time_interval", tsopts);
    convert_timeseries_option(opts, "target_loops", tsopts);

    ret.append(tsopts);
    ret.append(")");

    return ret;
}